

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O1

void __thiscall
kj::Vector<kj::CompressionParameters>::~Vector(Vector<kj::CompressionParameters> *this)

{
  CompressionParameters *pCVar1;
  RemoveConst<kj::CompressionParameters> *pRVar2;
  CompressionParameters *pCVar3;
  ArrayDisposer *pAVar4;
  
  pCVar1 = (this->builder).ptr;
  if (pCVar1 != (CompressionParameters *)0x0) {
    pRVar2 = (this->builder).pos;
    pCVar3 = (this->builder).endPtr;
    (this->builder).ptr = (CompressionParameters *)0x0;
    (this->builder).pos = (RemoveConst<kj::CompressionParameters> *)0x0;
    (this->builder).endPtr = (CompressionParameters *)0x0;
    pAVar4 = (this->builder).disposer;
    (**pAVar4->_vptr_ArrayDisposer)
              (pAVar4,pCVar1,0x28,((long)pRVar2 - (long)pCVar1 >> 3) * -0x3333333333333333,
               ((long)pCVar3 - (long)pCVar1 >> 3) * -0x3333333333333333,
               ArrayDisposer::Dispose_<kj::CompressionParameters>::destruct);
    return;
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    T* posCopy = pos;
    T* endCopy = endPtr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      pos = nullptr;
      endPtr = nullptr;
      disposer->dispose(ptrCopy, posCopy - ptrCopy, endCopy - ptrCopy);
    }
  }